

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

uv_os_sock_t create_tcp_socket(void)

{
  uv_stream_t *puVar1;
  uint uVar2;
  int iVar3;
  uv_os_sock_t uVar4;
  uv_os_sock_t extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_stream_t *puVar8;
  int iVar9;
  undefined8 *puVar10;
  long *plVar11;
  uv_connect_cb p_Var12;
  code *pcVar13;
  long *plVar14;
  uv_shutdown_t *puVar15;
  undefined1 *puVar16;
  uv_connect_t *puVar17;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  long alStack_418 [2];
  undefined1 auStack_408 [16];
  code *pcStack_3f8;
  void *pvStack_3f0;
  undefined1 auStack_3e8 [64];
  void *pvStack_3a8;
  uv_connect_cb ap_Stack_3a0 [2];
  uv__queue *puStack_390;
  uv__queue *puStack_388;
  code *pcStack_380;
  long lStack_370;
  long lStack_368;
  undefined1 auStack_360 [16];
  sockaddr sStack_350;
  long alStack_340 [27];
  code *pcStack_268;
  long lStack_258;
  long lStack_250;
  sockaddr sStack_248;
  long alStack_238 [27];
  code *pcStack_160;
  long lStack_158;
  long lStack_150;
  undefined1 auStack_148 [216];
  uv_stream_t *puStack_70;
  code *pcStack_68;
  undefined8 uStack_58;
  long lStack_50;
  undefined1 auStack_48 [16];
  ulong uStack_38;
  undefined8 local_20;
  void *local_18;
  undefined4 local_c;
  
  uVar2 = socket(2,1,0);
  local_18 = (void *)(long)(int)uVar2;
  local_20 = 0;
  if ((long)local_18 < 0) {
    create_tcp_socket_cold_2();
  }
  else {
    local_c = 1;
    iVar3 = setsockopt(uVar2,1,2,&stack0xfffffffffffffff4,4);
    local_18 = (void *)(long)iVar3;
    local_20 = 0;
    if (local_18 == (void *)0x0) {
      return uVar2;
    }
  }
  puVar8 = (uv_stream_t *)&stack0xffffffffffffffe8;
  puVar10 = &local_20;
  create_tcp_socket_cold_1();
  pcStack_68 = (code *)0x1ccd00;
  uStack_38 = (ulong)uVar2;
  auStack_48 = uv_buf_init("PING",4);
  puVar1 = connect_req.handle;
  if (puVar8 == (uv_stream_t *)&connect_req) {
    lStack_50 = (long)(int)puVar10;
    uStack_58 = 0;
    if (lStack_50 != 0) goto LAB_001ccdfb;
    connect_cb_called = connect_cb_called + 1;
    pcStack_68 = (code *)0x1ccd68;
    iVar3 = uv_write(&write_req,connect_req.handle,auStack_48,1,write_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    puVar8 = puVar1;
    if (lStack_50 != 0) goto LAB_001cce0a;
    pcStack_68 = (code *)0x1ccd9e;
    iVar3 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    if (lStack_50 != 0) goto LAB_001cce19;
    pcStack_68 = (code *)0x1ccdd0;
    iVar3 = uv_read_start(puVar1,alloc_cb,read_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    if (lStack_50 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_68 = (code *)0x1ccdfb;
    connect_cb_cold_1();
LAB_001ccdfb:
    pcStack_68 = (code *)0x1cce0a;
    connect_cb_cold_2();
LAB_001cce0a:
    pcStack_68 = (code *)0x1cce19;
    connect_cb_cold_3();
LAB_001cce19:
    pcStack_68 = (code *)0x1cce28;
    connect_cb_cold_4();
  }
  pcStack_68 = run_test_tcp_open_twice;
  connect_cb_cold_5();
  pcStack_160 = (code *)0x1cce45;
  puStack_70 = puVar8;
  pcStack_68 = (code *)((ulong)puVar10 & 0xffffffff);
  uVar4 = create_tcp_socket();
  pcStack_160 = (code *)0x1cce4c;
  uVar2 = create_tcp_socket();
  uVar6 = (ulong)uVar2;
  pcStack_160 = (code *)0x1cce53;
  uVar5 = uv_default_loop();
  pcStack_160 = (code *)0x1cce60;
  iVar3 = uv_tcp_init(uVar5,auStack_148);
  lStack_150 = (long)iVar3;
  lStack_158 = 0;
  if (lStack_150 == 0) {
    pcStack_160 = (code *)0x1cce8a;
    iVar3 = uv_tcp_open(auStack_148,uVar4);
    lStack_150 = (long)iVar3;
    lStack_158 = 0;
    if (lStack_150 != 0) goto LAB_001ccf7a;
    pcStack_160 = (code *)0x1cceb4;
    iVar3 = uv_tcp_open(auStack_148,uVar2);
    lStack_150 = (long)iVar3;
    lStack_158 = -0x10;
    if (lStack_150 != -0x10) goto LAB_001ccf87;
    pcStack_160 = (code *)0x1cced9;
    iVar3 = close(uVar2);
    lStack_150 = (long)iVar3;
    lStack_158 = 0;
    if (lStack_150 != 0) goto LAB_001ccf94;
    pcStack_160 = (code *)0x1ccf03;
    uv_close(auStack_148,0);
    pcStack_160 = (code *)0x1ccf08;
    uVar5 = uv_default_loop();
    pcStack_160 = (code *)0x1ccf12;
    uv_run(uVar5,0);
    pcStack_160 = (code *)0x1ccf17;
    uVar6 = uv_default_loop();
    pcStack_160 = (code *)0x1ccf2b;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_160 = (code *)0x1ccf35;
    uv_run(uVar6,0);
    lStack_150 = 0;
    pcStack_160 = (code *)0x1ccf43;
    uVar5 = uv_default_loop();
    pcStack_160 = (code *)0x1ccf4b;
    iVar3 = uv_loop_close(uVar5);
    lStack_158 = (long)iVar3;
    if (lStack_150 == lStack_158) {
      pcStack_160 = (code *)0x1ccf61;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_160 = (code *)0x1ccf7a;
    run_test_tcp_open_twice_cold_1();
LAB_001ccf7a:
    pcStack_160 = (code *)0x1ccf87;
    run_test_tcp_open_twice_cold_2();
LAB_001ccf87:
    pcStack_160 = (code *)0x1ccf94;
    run_test_tcp_open_twice_cold_3();
LAB_001ccf94:
    pcStack_160 = (code *)0x1ccfa1;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_160 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_268 = (code *)0x1ccfbb;
  pcStack_160 = (code *)uVar6;
  uVar2 = create_tcp_socket();
  pvVar7 = (void *)(ulong)uVar2;
  pcStack_268 = (code *)0x1ccfd3;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_248);
  alStack_238[0] = (long)iVar3;
  lStack_258 = 0;
  if (alStack_238[0] == 0) {
    pcStack_268 = (code *)0x1ccff8;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x1cd005;
    iVar3 = uv_tcp_init(uVar5,alStack_238);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd11e;
    pcStack_268 = (code *)0x1cd036;
    iVar3 = bind(uVar2,&sStack_248,0x10);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd12d;
    pcStack_268 = (code *)0x1cd062;
    iVar3 = uv_tcp_open(alStack_238,uVar2);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd13c;
    pcStack_268 = (code *)0x1cd093;
    iVar3 = uv_listen(alStack_238,0x80,0);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd14b;
    pcStack_268 = (code *)0x1cd0b8;
    pvVar7 = (void *)uv_default_loop();
    pcStack_268 = (code *)0x1cd0cc;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_268 = (code *)0x1cd0d6;
    uv_run(pvVar7,0);
    lStack_258 = 0;
    pcStack_268 = (code *)0x1cd0e4;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x1cd0ec;
    iVar3 = uv_loop_close(uVar5);
    lStack_250 = (long)iVar3;
    if (lStack_258 == lStack_250) {
      pcStack_268 = (code *)0x1cd104;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x1cd11e;
    run_test_tcp_open_bound_cold_1();
LAB_001cd11e:
    pcStack_268 = (code *)0x1cd12d;
    run_test_tcp_open_bound_cold_2();
LAB_001cd12d:
    pcStack_268 = (code *)0x1cd13c;
    run_test_tcp_open_bound_cold_3();
LAB_001cd13c:
    pcStack_268 = (code *)0x1cd14b;
    run_test_tcp_open_bound_cold_4();
LAB_001cd14b:
    pcStack_268 = (code *)0x1cd15a;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_268 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_380 = (code *)0x1cd182;
  pcStack_268 = (code *)pvVar7;
  auStack_360 = uv_buf_init("PING",4);
  pcStack_380 = (code *)0x1cd1a2;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_350);
  alStack_340[0] = (long)iVar3;
  lStack_370 = 0;
  if (alStack_340[0] == 0) {
    pcStack_380 = (code *)0x1cd1c7;
    uVar2 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar2;
    pcStack_380 = (code *)0x1cd1da;
    iVar3 = connect(uVar2,&sStack_350,0x10);
    alStack_340[0] = (long)iVar3;
    lStack_370 = 0;
    if (alStack_340[0] != 0) goto LAB_001cd3f7;
    pcStack_380 = (code *)0x1cd1ff;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd20c;
    iVar3 = uv_tcp_init(uVar5,alStack_340);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd406;
    pcStack_380 = (code *)0x1cd238;
    iVar3 = uv_tcp_open(alStack_340,uVar2);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd415;
    pcStack_380 = (code *)0x1cd27a;
    iVar3 = uv_write(&write_req,alStack_340,auStack_360,1,write_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd424;
    pcStack_380 = (code *)0x1cd2b2;
    iVar3 = uv_shutdown(&shutdown_req,alStack_340,shutdown_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd433;
    pcStack_380 = (code *)0x1cd2ea;
    iVar3 = uv_read_start(alStack_340,alloc_cb,read_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd442;
    pcStack_380 = (code *)0x1cd30f;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd319;
    uv_run(uVar5,0);
    lStack_370 = 1;
    lStack_368 = (long)shutdown_cb_called;
    if (lStack_368 != 1) goto LAB_001cd451;
    lStack_370 = 1;
    lStack_368 = (long)write_cb_called;
    if (lStack_368 != 1) goto LAB_001cd460;
    lStack_370 = 1;
    lStack_368 = (long)close_cb_called;
    if (lStack_368 != 1) goto LAB_001cd46f;
    pcStack_380 = (code *)0x1cd38d;
    pvVar7 = (void *)uv_default_loop();
    pcStack_380 = (code *)0x1cd3a1;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_380 = (code *)0x1cd3ab;
    uv_run(pvVar7,0);
    lStack_370 = 0;
    pcStack_380 = (code *)0x1cd3b9;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd3c1;
    iVar3 = uv_loop_close(uVar5);
    lStack_368 = (long)iVar3;
    if (lStack_370 == lStack_368) {
      pcStack_380 = (code *)0x1cd3dd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_380 = (code *)0x1cd3f7;
    run_test_tcp_open_connected_cold_1();
LAB_001cd3f7:
    pcStack_380 = (code *)0x1cd406;
    run_test_tcp_open_connected_cold_2();
LAB_001cd406:
    pcStack_380 = (code *)0x1cd415;
    run_test_tcp_open_connected_cold_3();
LAB_001cd415:
    pcStack_380 = (code *)0x1cd424;
    run_test_tcp_open_connected_cold_4();
LAB_001cd424:
    pcStack_380 = (code *)0x1cd433;
    run_test_tcp_open_connected_cold_5();
LAB_001cd433:
    pcStack_380 = (code *)0x1cd442;
    run_test_tcp_open_connected_cold_6();
LAB_001cd442:
    pcStack_380 = (code *)0x1cd451;
    run_test_tcp_open_connected_cold_7();
LAB_001cd451:
    pcStack_380 = (code *)0x1cd460;
    run_test_tcp_open_connected_cold_8();
LAB_001cd460:
    pcStack_380 = (code *)0x1cd46f;
    run_test_tcp_open_connected_cold_9();
LAB_001cd46f:
    pcStack_380 = (code *)0x1cd47e;
    run_test_tcp_open_connected_cold_10();
  }
  plVar14 = &lStack_370;
  plVar11 = &lStack_368;
  pcStack_380 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if (plVar14 == (long *)0x0) {
    puStack_388 = (uv__queue *)0x1cd4a4;
    write_cb_cold_2();
  }
  else if ((int)plVar11 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar3 = (int)plVar11;
  puVar15 = (uv_shutdown_t *)((ulong)plVar11 & 0xffffffff);
  puStack_388 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar15 == &shutdown_req) {
    puStack_388 = (uv__queue *)(long)iVar3;
    puStack_390 = (uv__queue *)0x0;
    if (puStack_388 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar3;
    }
  }
  else {
    ap_Stack_3a0[0] = (uv_connect_cb)0x1cd4e8;
    shutdown_cb_cold_1();
  }
  p_Var12 = (uv_connect_cb)(auStack_3e8 + 0x58);
  ap_Stack_3a0[0] = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_3a8 = (void *)0x10000;
  if ((long)p_Var12 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x37fb20;
  }
  puVar16 = auStack_3e8 + 0x48;
  pcVar13 = (code *)(auStack_3e8 + 0x40);
  auStack_3e8._48_8_ = read_cb;
  ap_Stack_3a0[0] = p_Var12;
  alloc_cb_cold_1();
  if (puVar16 == (undefined1 *)0x0) {
    auStack_3e8._24_8_ = (void *)0x1cd5c8;
    read_cb_cold_4();
LAB_001cd5c8:
    auStack_3e8._24_8_ = (void *)0x1cd5d7;
    read_cb_cold_2();
LAB_001cd5d7:
    auStack_3e8._24_8_ = (void *)0x1cd5e6;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)pcVar13) {
      auStack_3e8._48_8_ = (code *)0x4;
      auStack_3e8._40_8_ = pcVar13;
      if (pcVar13 != (code *)0x4) goto LAB_001cd5c8;
      auStack_3e8._24_8_ = (void *)0x1cd578;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      auStack_3e8._48_8_ = SEXT48(iVar3);
      auStack_3e8._40_8_ = (code *)0x0;
      if ((code *)auStack_3e8._48_8_ == (code *)0x0) {
        return iVar3;
      }
      goto LAB_001cd5d7;
    }
    auStack_3e8._40_8_ = (code *)0xfffffffffffff001;
    auStack_3e8._48_8_ = pcVar13;
    if (pcVar13 == (code *)0xfffffffffffff001) {
      uVar4 = uv_close();
      return uVar4;
    }
  }
  auStack_3e8._24_8_ = run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar9 = (int)&pvStack_3f0;
  pcStack_3f8 = (code *)0x1cd610;
  auStack_3e8._24_8_ = pvVar7;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_3e8 + 8);
  auStack_3e8._0_8_ = SEXT48(iVar3);
  pvStack_3f0 = (void *)0x0;
  if ((void *)auStack_3e8._0_8_ == (void *)0x0) {
    pcStack_3f8 = (code *)0x1cd633;
    uVar2 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar2;
    pcStack_3f8 = (code *)0x1cd63a;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cd649;
    iVar3 = uv_tcp_init(uVar5,&client);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cd7f6;
    pcStack_3f8 = (code *)0x1cd675;
    iVar3 = uv_tcp_open(&client,uVar2);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cd803;
    pcStack_3f8 = (code *)0x1cd6b2;
    iVar3 = uv_tcp_connect(&connect_req,&client,auStack_3e8 + 8,connect1_cb);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cd810;
    pcStack_3f8 = (code *)0x1cd6d5;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cd6df;
    uv_run(uVar5,0);
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)shutdown_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cd81d;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)shutdown_requested;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cd82a;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)connect_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cd837;
    auStack_3e8._0_8_ = SEXT48(write_cb_called);
    pvStack_3f0 = (void *)0x0;
    if ((long)auStack_3e8._0_8_ < 1) goto LAB_001cd844;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)close_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cd851;
    pcStack_3f8 = (code *)0x1cd793;
    pvVar7 = (void *)uv_default_loop();
    pcStack_3f8 = (code *)0x1cd7a7;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_3f8 = (code *)0x1cd7b1;
    uv_run(pvVar7,0);
    auStack_3e8._0_8_ = (void *)0x0;
    pcStack_3f8 = (code *)0x1cd7bf;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cd7c7;
    iVar3 = uv_loop_close(uVar5);
    pvStack_3f0 = (void *)(long)iVar3;
    if ((void *)auStack_3e8._0_8_ == pvStack_3f0) {
      pcStack_3f8 = (code *)0x1cd7e1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3f8 = (code *)0x1cd7f6;
    run_test_tcp_write_ready_cold_1();
LAB_001cd7f6:
    pcStack_3f8 = (code *)0x1cd803;
    run_test_tcp_write_ready_cold_2();
LAB_001cd803:
    pcStack_3f8 = (code *)0x1cd810;
    run_test_tcp_write_ready_cold_3();
LAB_001cd810:
    pcStack_3f8 = (code *)0x1cd81d;
    run_test_tcp_write_ready_cold_4();
LAB_001cd81d:
    pcStack_3f8 = (code *)0x1cd82a;
    run_test_tcp_write_ready_cold_5();
LAB_001cd82a:
    pcStack_3f8 = (code *)0x1cd837;
    run_test_tcp_write_ready_cold_6();
LAB_001cd837:
    pcStack_3f8 = (code *)0x1cd844;
    run_test_tcp_write_ready_cold_7();
LAB_001cd844:
    pcStack_3f8 = (code *)0x1cd851;
    run_test_tcp_write_ready_cold_8();
LAB_001cd851:
    pcStack_3f8 = (code *)0x1cd85e;
    run_test_tcp_write_ready_cold_9();
  }
  puVar17 = (uv_connect_t *)auStack_3e8;
  pcStack_3f8 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar8 = connect_req.handle;
  plVar14 = alStack_418;
  pcStack_3f8 = (code *)pvVar7;
  if (puVar17 == &connect_req) {
    auStack_408._0_8_ = SEXT48(iVar9);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cd9a6;
    connect_cb_called = connect_cb_called + 1;
    uVar5 = uv_default_loop();
    iVar3 = uv_timer_init(uVar5,&tm);
    auStack_408._0_8_ = SEXT48(iVar3);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cd9b3;
    iVar3 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_408._0_8_ = SEXT48(iVar3);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cd9c0;
    auStack_408 = uv_buf_init("P",1);
    iVar3 = uv_write(&write_req,puVar8,auStack_408,1,write1_cb);
    alStack_418[0] = (long)iVar3;
    alStack_418[1] = 0;
    if (alStack_418[0] == 0) {
      iVar3 = uv_read_start(puVar8,alloc_cb,read1_cb);
      alStack_418[0] = (long)iVar3;
      alStack_418[1] = 0;
      if (alStack_418[0] == 0) {
        return iVar3;
      }
      goto LAB_001cd9da;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cd9a6:
    connect1_cb_cold_2();
LAB_001cd9b3:
    connect1_cb_cold_3();
LAB_001cd9c0:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cd9da:
  connect1_cb_cold_6();
  iVar3 = uv_is_closing();
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar4 = uv_close(plVar14,0);
  return uVar4;
}

Assistant:

static uv_os_sock_t create_tcp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}